

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

double ipx::Infnorm(SparseMatrix *A)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  Vector rowsum;
  valarray<double> local_20;
  double local_10;
  
  std::valarray<double>::valarray(&local_20,(long)A->nrow_);
  piVar3 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar7 = 0; lVar7 < ((long)piVar4 - (long)piVar3) * 0x40000000 + -0x100000000 >> 0x20;
      lVar7 = lVar7 + 1) {
    iVar1 = piVar3[lVar7 + 1];
    piVar5 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = (long)piVar3[lVar7]; lVar8 < iVar1; lVar8 = lVar8 + 1) {
      iVar2 = piVar5[lVar8];
      local_20._M_data[iVar2] = ABS(pdVar6[lVar8]) + local_20._M_data[iVar2];
    }
  }
  local_10 = Infnorm(&local_20);
  operator_delete(local_20._M_data);
  return local_10;
}

Assistant:

double Infnorm(const SparseMatrix& A) {
    Vector rowsum(A.rows());
    for (Int j = 0; j < A.cols(); j++) {
        for (Int p = A.begin(j); p < A.end(j); p++)
            rowsum[A.index(p)] += std::abs(A.value(p));
    }
    return Infnorm(rowsum);
}